

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cabal.c
# Opt level: O0

void spell_calm(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *in_RDX;
  int in_EDI;
  AFFECT_DATA af;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  CHAR_DATA *in_stack_ffffffffffffff80;
  
  bVar1 = is_affected(in_RDX,(int)gsn_rage);
  if ((!bVar1) || (bVar1 = is_affected(in_RDX,in_EDI), bVar1)) {
    send_to_char((char *)in_stack_ffffffffffffff80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    iVar2 = number_percent();
    iVar3 = get_skill((CHAR_DATA *)af.beat_fun,af._92_4_);
    if (iVar3 < iVar2) {
      send_to_char((char *)in_stack_ffffffffffffff80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    else {
      skill_lookup((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      affect_strip(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      init_affect((AFFECT_DATA *)0x64f667);
      affect_to_char((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff70),(AFFECT_DATA *)in_RDX);
      affect_to_char((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff70),(AFFECT_DATA *)in_RDX);
      send_to_char((char *)in_stack_ffffffffffffff80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  return;
}

Assistant:

void spell_calm(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (!is_affected(ch, gsn_rage) || is_affected(ch, sn))
	{
		send_to_char("Calm yourself?  You don't feel very angry.\n\r", ch);
		return;
	}

	if (number_percent() > get_skill(ch, sn))
	{
		send_to_char("You try to calm yourself but your rage overcomes you.\n\r", ch);
		return;
	}

	affect_strip(ch, skill_lookup("rage"));
	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = sn;
	af.aftype = AFT_POWER;
	af.modifier = -8;
	af.level = level;
	af.duration = 3;
	af.location = APPLY_HITROLL;
	affect_to_char(ch, &af);

	af.location = APPLY_DAMROLL;
	affect_to_char(ch, &af);

	send_to_char("You manage to snap out of your rage.\n\r", ch);
}